

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall
fasttext::HierarchicalSoftmaxLoss::dfs
          (HierarchicalSoftmaxLoss *this,int32_t node,real score,Predictions *predictions,
          Vector *hidden)

{
  int32_t node_00;
  int iVar1;
  pointer pNVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  float fVar7;
  real rVar8;
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  float local_38;
  int local_30;
  float local_2c;
  
  auVar9._4_60_ = in_register_00001204;
  auVar9._0_4_ = score;
  local_38 = score;
  local_30 = node;
  while( true ) {
    auVar6 = auVar9._0_16_;
    lVar5 = (long)local_30;
    pNVar2 = (this->tree_).
             super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pNVar2[lVar5].left == -1) && (pNVar2[lVar5].right == -1)) break;
    peVar3 = (((this->super_BinaryLogisticLoss).super_Loss.wo_)->
             super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar3->_vptr_Matrix[2])(peVar3,hidden,lVar5 - this->osz_);
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar6 = vxorps_avx512vl(auVar6,auVar4);
    fVar7 = expf(auVar6._0_4_);
    node_00 = (this->tree_).
              super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar5].left;
    fVar7 = 1.0 / (fVar7 + 1.0);
    rVar8 = std_log(1.0 - fVar7);
    dfs(this,node_00,rVar8 + local_38,predictions,hidden);
    iVar1 = (this->tree_).
            super__Vector_base<fasttext::HierarchicalSoftmaxLoss::Node,_std::allocator<fasttext::HierarchicalSoftmaxLoss::Node>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar5].right;
    auVar9._0_4_ = std_log(fVar7);
    auVar9._4_60_ = extraout_var;
    local_38 = local_38 + auVar9._0_4_;
    local_30 = iVar1;
  }
  local_2c = local_38;
  std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::emplace_back<float&,int&>
            ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)predictions,
             &local_2c,&local_30);
  return;
}

Assistant:

void HierarchicalSoftmaxLoss::dfs(
    int32_t node,
    real score,
    Predictions& predictions,
    const Vector& hidden) const {

  if (tree_[node].left == -1 && tree_[node].right == -1) {
    predictions.emplace_back(score, node);
    return;
  }

  real f = wo_->dotRow(hidden, node - osz_);
  f = 1. / (1 + std::exp(-f));

  dfs(tree_[node].left, score + std_log(1.0 - f), predictions, hidden);
  dfs(tree_[node].right, score + std_log(f), predictions, hidden);
}